

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O0

void av1_quick_txfm(int use_hadamard,TX_SIZE tx_size,BitDepthInfo bd_info,int16_t *src_diff,
                   int src_stride,tran_low_t *coeff)

{
  tran_low_t *in_RDX;
  int in_EDI;
  TxfmParam txfm_param;
  TxfmParam *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  undefined2 in_stack_ffffffffffffffc2;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd1;
  TX_SIZE in_stack_ffffffffffffffd7;
  undefined4 uStack_4;
  
  uStack_4 = (int)((ulong)in_RDX >> 0x20);
  if (in_EDI == 0) {
    av1_fwd_txfm((int16_t *)
                 CONCAT17(in_stack_ffffffffffffffd7,CONCAT61(in_stack_ffffffffffffffd1,5)),in_RDX,0,
                 in_stack_ffffffffffffffb8);
  }
  else if (uStack_4 == 0) {
    wht_fwd_txfm(in_stack_ffffffffffffffd7,
                 (int16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 CONCAT44(in_stack_ffffffffffffffc4,
                          CONCAT22(in_stack_ffffffffffffffc2,
                                   CONCAT11(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0))),
                 (tran_low_t *)in_stack_ffffffffffffffb8);
  }
  else {
    highbd_wht_fwd_txfm(in_stack_ffffffffffffffd7,
                        (int16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        CONCAT44(in_stack_ffffffffffffffc4,
                                 CONCAT22(in_stack_ffffffffffffffc2,
                                          CONCAT11(in_stack_ffffffffffffffc1,
                                                   in_stack_ffffffffffffffc0))),
                        (tran_low_t *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void av1_quick_txfm(int use_hadamard, TX_SIZE tx_size, BitDepthInfo bd_info,
                    const int16_t *src_diff, int src_stride,
                    tran_low_t *coeff) {
  if (use_hadamard) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (bd_info.use_highbitdepth_buf) {
      highbd_wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
    } else {
      wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
    }
#else
    wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
#endif  // CONFIG_AV1_HIGHBITDEPTH
  } else {
    TxfmParam txfm_param;
    txfm_param.tx_type = DCT_DCT;
    txfm_param.tx_size = tx_size;
    txfm_param.lossless = 0;
    txfm_param.bd = bd_info.bit_depth;
    txfm_param.is_hbd = bd_info.use_highbitdepth_buf;
    txfm_param.tx_set_type = EXT_TX_SET_ALL16;
    av1_fwd_txfm(src_diff, coeff, src_stride, &txfm_param);
  }
}